

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBlobImpl.cpp
# Opt level: O0

void * __thiscall
Diligent::DataBlobAllocatorAdapter::Allocate
          (DataBlobAllocatorAdapter *this,size_t Size,Char *dbgDescription,char *dbgFileName,
          Int32 dbgLineNumber)

{
  bool bVar1;
  Char *Message;
  DataBlobImpl *this_00;
  void *pvVar2;
  undefined1 local_68 [24];
  undefined1 local_50 [8];
  string msg;
  Int32 dbgLineNumber_local;
  char *dbgFileName_local;
  Char *dbgDescription_local;
  size_t Size_local;
  DataBlobAllocatorAdapter *this_local;
  
  msg.field_2._12_4_ = dbgLineNumber;
  bVar1 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator!(&this->m_pDataBlob);
  if (!bVar1) {
    FormatString<char[91]>
              ((string *)local_50,
               (char (*) [91])
               "The data blob has already been created. The allocator does not support more than one blob."
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
               ,0x72);
    std::__cxx11::string::~string((string *)local_50);
  }
  DataBlobImpl::Create((DataBlobImpl *)local_68,Size,(void *)0x0);
  RefCntAutoPtr<Diligent::DataBlobImpl>::operator=
            (&this->m_pDataBlob,(RefCntAutoPtr<Diligent::DataBlobImpl> *)local_68);
  RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_68);
  this_00 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->(&this->m_pDataBlob);
  pvVar2 = DataBlobImpl::GetDataPtr(this_00,0);
  return pvVar2;
}

Assistant:

void* DataBlobAllocatorAdapter::Allocate(size_t Size, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY(!m_pDataBlob, "The data blob has already been created. The allocator does not support more than one blob.");
    m_pDataBlob = DataBlobImpl::Create(Size);
    return m_pDataBlob->GetDataPtr();
}